

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::ParseProtoCurliesOrIdent(Parser *this)

{
  char cVar1;
  int nesting;
  int iVar2;
  long in_RSI;
  
  iVar2 = *(int *)(in_RSI + 0x1c);
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  cVar1 = *(char *)&(this->super_ParserState).prev_cursor_;
  if (iVar2 == 0x7b) {
    if (cVar1 == '\0') {
      iVar2 = 1;
      do {
        if (iVar2 == 0) goto LAB_0011e550;
        if (*(int *)(in_RSI + 0x1c) == 0x7d) {
          iVar2 = iVar2 + -1;
        }
        else if (*(int *)(in_RSI + 0x1c) == 0x7b) {
          iVar2 = iVar2 + 1;
        }
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      } while (*(char *)&(this->super_ParserState).prev_cursor_ == '\0');
    }
  }
  else if (cVar1 == '\0') {
LAB_0011e550:
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoCurliesOrIdent() {
  if (Is('{')) {
    NEXT();
    for (int nesting = 1; nesting;) {
      if (token_ == '{')
        nesting++;
      else if (token_ == '}')
        nesting--;
      NEXT();
    }
  } else {
    NEXT();  // Any single token.
  }
  return NoError();
}